

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float tcu::sampleCubeArraySeamlessCompare
                (ConstPixelBufferAccess *levels,int numLevels,int slice,CubeFace face,
                Sampler *sampler,float ref,float s,float t,float lod)

{
  int iVar1;
  int iVar2;
  int levelNdx;
  float fVar3;
  ConstPixelBufferAccess *local_560;
  ConstPixelBufferAccess *local_548;
  ConstPixelBufferAccess *local_530;
  ConstPixelBufferAccess *local_518;
  FilterMode local_508;
  ConstPixelBufferAccess local_500;
  ConstPixelBufferAccess local_4d8;
  CubeFace local_4ac;
  undefined1 local_4a8 [4];
  int i_2;
  ConstPixelBufferAccess faceAccesses1 [6];
  ConstPixelBufferAccess faceAccesses0 [6];
  float local_2c0;
  float t1;
  float t0;
  float f;
  FilterMode levelFilter_1;
  int level1;
  int level0;
  int maxLevel_1;
  CubeFace local_27c;
  undefined1 local_278 [4];
  int i_1;
  ConstPixelBufferAccess faceAccesses_1 [6];
  FilterMode levelFilter;
  int level;
  int maxLevel;
  CubeFace local_14c;
  undefined1 local_148 [4];
  int i;
  ConstPixelBufferAccess faceAccesses [6];
  FilterMode filterMode;
  bool magnified;
  int faceDepth;
  float lod_local;
  float t_local;
  float s_local;
  float ref_local;
  Sampler *sampler_local;
  CubeFace face_local;
  int slice_local;
  int numLevels_local;
  ConstPixelBufferAccess *levels_local;
  
  iVar1 = getCubeArrayFaceIndex(face);
  iVar1 = slice * 6 + iVar1;
  if (sampler->lodThreshold < lod) {
    local_508 = sampler->minFilter;
  }
  else {
    local_508 = sampler->magFilter;
  }
  switch(local_508) {
  case NEAREST:
    levels_local._4_4_ = sampleCubeSeamlessNearestCompare(levels,sampler,ref,s,t,iVar1);
    break;
  case LINEAR:
    local_518 = (ConstPixelBufferAccess *)local_148;
    do {
      ConstPixelBufferAccess::ConstPixelBufferAccess(local_518);
      local_518 = local_518 + 1;
    } while (local_518 != (ConstPixelBufferAccess *)&faceAccesses[5].m_data);
    for (local_14c = CUBEFACE_NEGATIVE_X; (int)local_14c < 6;
        local_14c = local_14c + CUBEFACE_POSITIVE_X) {
      getCubeArrayFaceAccess((ConstPixelBufferAccess *)&level,levels,0,slice,local_14c);
      memcpy(local_148 + (long)(int)local_14c * 0x28,&level,0x28);
    }
    levels_local._4_4_ =
         sampleCubeSeamlessLinearCompare
                   ((ConstPixelBufferAccess (*) [6])local_148,face,sampler,ref,s,t);
    break;
  case NEAREST_MIPMAP_NEAREST:
  case LINEAR_MIPMAP_NEAREST:
    fVar3 = deFloatCeil(lod + 0.5);
    iVar2 = deClamp32((int)fVar3 + -1,0,numLevels + -1);
    faceAccesses_1[5].m_data._4_4_ = (uint)(local_508 == LINEAR_MIPMAP_NEAREST);
    if (faceAccesses_1[5].m_data._4_4_ == 0) {
      levels_local._4_4_ = sampleCubeSeamlessNearestCompare(levels + iVar2,sampler,ref,s,t,iVar1);
    }
    else {
      local_530 = (ConstPixelBufferAccess *)local_278;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess(local_530);
        local_530 = local_530 + 1;
      } while (local_530 != (ConstPixelBufferAccess *)&faceAccesses_1[5].m_data);
      for (local_27c = CUBEFACE_NEGATIVE_X; (int)local_27c < 6;
          local_27c = local_27c + CUBEFACE_POSITIVE_X) {
        getCubeArrayFaceAccess((ConstPixelBufferAccess *)&level0,levels,iVar2,slice,local_27c);
        memcpy(local_278 + (long)(int)local_27c * 0x28,&level0,0x28);
      }
      levels_local._4_4_ =
           sampleCubeSeamlessLinearCompare
                     ((ConstPixelBufferAccess (*) [6])local_278,face,sampler,ref,s,t);
    }
    break;
  case NEAREST_MIPMAP_LINEAR:
  case LINEAR_MIPMAP_LINEAR:
    fVar3 = ::deFloatFloor(lod);
    iVar2 = deClamp32((int)fVar3,0,numLevels + -1);
    levelNdx = de::min<int>(numLevels + -1,iVar2 + 1);
    fVar3 = deFloatFrac(lod);
    if (local_508 == LINEAR_MIPMAP_LINEAR) {
      local_548 = (ConstPixelBufferAccess *)&faceAccesses1[5].m_data;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess(local_548);
        local_548 = local_548 + 1;
      } while (local_548 != (ConstPixelBufferAccess *)&faceAccesses0[5].m_data);
      local_560 = (ConstPixelBufferAccess *)local_4a8;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess(local_560);
        local_560 = local_560 + 1;
      } while (local_560 != (ConstPixelBufferAccess *)&faceAccesses1[5].m_data);
      for (local_4ac = CUBEFACE_NEGATIVE_X; (int)local_4ac < 6;
          local_4ac = local_4ac + CUBEFACE_POSITIVE_X) {
        getCubeArrayFaceAccess(&local_4d8,levels,iVar2,slice,local_4ac);
        memcpy(&faceAccesses1[(long)(int)local_4ac + 5].m_data,&local_4d8,0x28);
        getCubeArrayFaceAccess(&local_500,levels,levelNdx,slice,local_4ac);
        memcpy(local_4a8 + (long)(int)local_4ac * 0x28,&local_500,0x28);
      }
      local_2c0 = sampleCubeSeamlessLinearCompare
                            ((ConstPixelBufferAccess (*) [6])&faceAccesses1[5].m_data,face,sampler,
                             ref,s,t);
      faceAccesses0[5].m_data._4_4_ =
           sampleCubeSeamlessLinearCompare
                     ((ConstPixelBufferAccess (*) [6])local_4a8,face,sampler,ref,s,t);
    }
    else {
      local_2c0 = sampleCubeSeamlessNearestCompare(levels + iVar2,sampler,ref,s,t,iVar1);
      faceAccesses0[5].m_data._4_4_ =
           sampleCubeSeamlessNearestCompare(levels + levelNdx,sampler,ref,s,t,iVar1);
    }
    levels_local._4_4_ = local_2c0 * (1.0 - fVar3) + faceAccesses0[5].m_data._4_4_ * fVar3;
    break;
  default:
    levels_local._4_4_ = 0.0;
  }
  return levels_local._4_4_;
}

Assistant:

static float sampleCubeArraySeamlessCompare (const ConstPixelBufferAccess* const levels, int numLevels, int slice, CubeFace face, const Sampler& sampler, float ref, float s, float t, float lod)
{
	const int			faceDepth	= (slice * 6) + getCubeArrayFaceIndex(face);
	const bool			magnified	= lod <= sampler.lodThreshold;
	Sampler::FilterMode	filterMode	= magnified ? sampler.magFilter : sampler.minFilter;

	switch (filterMode)
	{
		case Sampler::NEAREST:
			return sampleCubeSeamlessNearestCompare(levels[0], sampler, ref, s, t, faceDepth);

		case Sampler::LINEAR:
		{
			ConstPixelBufferAccess faceAccesses[CUBEFACE_LAST];
			for (int i = 0; i < (int)CUBEFACE_LAST; i++)
				faceAccesses[i] = getCubeArrayFaceAccess(levels, 0, slice, (CubeFace)i);

			return sampleCubeSeamlessLinearCompare(faceAccesses, face, sampler, ref, s, t);
		}

		case Sampler::NEAREST_MIPMAP_NEAREST:
		case Sampler::LINEAR_MIPMAP_NEAREST:
		{
			int						maxLevel	= (int)numLevels-1;
			int						level		= deClamp32((int)deFloatCeil(lod + 0.5f) - 1, 0, maxLevel);
			Sampler::FilterMode		levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_NEAREST) ? Sampler::LINEAR : Sampler::NEAREST;

			if (levelFilter == Sampler::NEAREST)
				return sampleCubeSeamlessNearestCompare(levels[level], sampler, ref, s, t, faceDepth);
			else
			{
				DE_ASSERT(levelFilter == Sampler::LINEAR);

				ConstPixelBufferAccess faceAccesses[CUBEFACE_LAST];
				for (int i = 0; i < (int)CUBEFACE_LAST; i++)
					faceAccesses[i] = getCubeArrayFaceAccess(levels, level, slice, (CubeFace)i);

				return sampleCubeSeamlessLinearCompare(faceAccesses, face, sampler, ref, s, t);
			}
		}

		case Sampler::NEAREST_MIPMAP_LINEAR:
		case Sampler::LINEAR_MIPMAP_LINEAR:
		{
			int						maxLevel	= (int)numLevels-1;
			int						level0		= deClamp32((int)deFloatFloor(lod), 0, maxLevel);
			int						level1		= de::min(maxLevel, level0 + 1);
			Sampler::FilterMode		levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_LINEAR) ? Sampler::LINEAR : Sampler::NEAREST;
			float					f			= deFloatFrac(lod);
			float					t0;
			float					t1;

			if (levelFilter == Sampler::NEAREST)
			{
				t0 = sampleCubeSeamlessNearestCompare(levels[level0], sampler, ref, s, t, faceDepth);
				t1 = sampleCubeSeamlessNearestCompare(levels[level1], sampler, ref, s, t, faceDepth);
			}
			else
			{
				DE_ASSERT(levelFilter == Sampler::LINEAR);

				ConstPixelBufferAccess faceAccesses0[CUBEFACE_LAST];
				ConstPixelBufferAccess faceAccesses1[CUBEFACE_LAST];
				for (int i = 0; i < (int)CUBEFACE_LAST; i++)
				{
					faceAccesses0[i] = getCubeArrayFaceAccess(levels, level0, slice, (CubeFace)i);
					faceAccesses1[i] = getCubeArrayFaceAccess(levels, level1, slice, (CubeFace)i);
				}

				t0 = sampleCubeSeamlessLinearCompare(faceAccesses0, face, sampler, ref, s, t);
				t1 = sampleCubeSeamlessLinearCompare(faceAccesses1, face, sampler, ref, s, t);
			}

			return t0*(1.0f - f) + t1*f;
		}

		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}